

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

int slist_search(int n,Symbol *s)

{
  long in_RSI;
  int in_EDI;
  int *pi;
  int i;
  char *in_stack_ffffffffffffffd8;
  int *piVar1;
  int local_14;
  
  piVar1 = *(int **)(in_RSI + 0x18);
  if (piVar1 == (int *)0x0) {
    diag((char *)0x0,in_stack_ffffffffffffffd8);
  }
  if (piVar1 != (int *)0x0) {
    local_14 = 0;
    while( true ) {
      if (*piVar1 <= local_14) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                      ,0xaba,"int slist_search()");
      }
      if (piVar1[local_14 * 2 + 1] == in_EDI) break;
      local_14 = local_14 + 1;
    }
    return piVar1[local_14 * 2 + 2];
  }
  __assert_fail("pi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                ,0xab4,"int slist_search()");
}

Assistant:

int slist_search(n, s) int n; Symbol* s; {
	int i, *pi;
	pi = s->slist_info_;
if (pi == (int*)0) {
	diag(s->name, " not really a STATE; Ie. No differential equation for it.\n");
}
	assert(pi);
	for (i=0; i < pi[0]; ++i) {
		if (pi[1+2*i] == n) {
			return pi[2+2*i];
		}
	}
	assert(0);
	return 0;
}